

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_>
slang::ast::SemanticFacts::getDriveStrength(NetStrengthSyntax *syntax)

{
  TokenKind TVar1;
  SyntaxKind SVar2;
  DriveStrength DVar3;
  bool bVar4;
  DriveStrength DVar5;
  DriveStrength DVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  pair<std::optional<slang::ast::DriveStrength>,_std::optional<slang::ast::DriveStrength>_> pVar10;
  
  SVar2 = (syntax->super_SyntaxNode).kind;
  if (SVar2 == PullStrength) {
    uVar8 = 0x100000000;
    TVar1 = *(TokenKind *)&syntax[1].super_SyntaxNode.previewNode;
    DVar5 = getDriveStrengthVal(TVar1);
    uVar7 = (ulong)DVar5;
    bVar4 = slang::syntax::SyntaxFacts::isStrength0(TVar1);
    if (!bVar4) {
      DVar5 = Supply;
      uVar9 = 0;
      goto LAB_003d92d9;
    }
    uVar9 = 0x100000000;
  }
  else {
    if (SVar2 == DriveStrength) {
      uVar9 = 0x100000000;
      DVar5 = getDriveStrengthVal(*(TokenKind *)&syntax[1].super_SyntaxNode.previewNode);
      TVar1 = (TokenKind)syntax[3].super_SyntaxNode.kind;
      DVar6 = getDriveStrengthVal(TVar1);
      bVar4 = slang::syntax::SyntaxFacts::isStrength0(TVar1);
      DVar3 = DVar6;
      if (bVar4) {
        DVar3 = DVar5;
        DVar5 = DVar6;
      }
      uVar7 = (ulong)DVar3;
      uVar8 = 0x100000000;
      goto LAB_003d92d9;
    }
    DVar5 = Supply;
    uVar9 = 0;
  }
  uVar7 = 0;
  uVar8 = 0;
LAB_003d92d9:
  pVar10.first.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DriveStrength> =
       (_Optional_base<slang::ast::DriveStrength,_true,_true>)(DVar5 | uVar9);
  pVar10.second.super__Optional_base<slang::ast::DriveStrength,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ast::DriveStrength> =
       (_Optional_base<slang::ast::DriveStrength,_true,_true>)(uVar7 | uVar8);
  return pVar10;
}

Assistant:

std::pair<std::optional<DriveStrength>, std::optional<DriveStrength>> SemanticFacts::
    getDriveStrength(const syntax::NetStrengthSyntax& syntax) {

    if (syntax.kind == SyntaxKind::DriveStrength) {
        auto& ds = syntax.as<DriveStrengthSyntax>();
        auto val0 = getDriveStrengthVal(ds.strength0.kind);
        auto val1 = getDriveStrengthVal(ds.strength1.kind);
        if (SyntaxFacts::isStrength0(ds.strength1.kind))
            std::swap(val0, val1);

        return {val0, val1};
    }
    else if (syntax.kind == SyntaxKind::PullStrength) {
        auto kind = syntax.as<PullStrengthSyntax>().strength.kind;
        auto val = getDriveStrengthVal(kind);
        if (SyntaxFacts::isStrength0(kind))
            return {val, {}};
        else
            return {{}, val};
    }
    else {
        return {{}, {}};
    }
}